

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O0

void __thiscall SQCompilation::RenderVisitor::visitDeclGroup(RenderVisitor *this,DeclGroup *grp)

{
  size_type_conflict sVar1;
  ArenaVector<SQCompilation::VarDecl_*> *pAVar2;
  DeclGroup *in_RSI;
  OutputStream *in_RDI;
  SQUnsignedInteger i;
  RenderVisitor *s;
  RenderVisitor *visitor;
  
  s = (RenderVisitor *)0x0;
  while( true ) {
    visitor = s;
    pAVar2 = DeclGroup::declarations(in_RSI);
    sVar1 = ArenaVector<SQCompilation::VarDecl_*>::size(pAVar2);
    if ((RenderVisitor *)(ulong)sVar1 <= s) break;
    if (visitor != (RenderVisitor *)0x0) {
      OutputStream::writeString(in_RDI,(char *)s);
    }
    pAVar2 = DeclGroup::declarations(in_RSI);
    ArenaVector<SQCompilation::VarDecl_*>::operator[](pAVar2,(size_type_conflict)visitor);
    Node::visit<SQCompilation::RenderVisitor>((Node *)in_RSI,visitor);
    s = (RenderVisitor *)((long)&(visitor->super_Visitor)._vptr_Visitor + 1);
  }
  return;
}

Assistant:

virtual void visitDeclGroup(DeclGroup *grp) {
        for (SQUnsignedInteger i = 0; i < grp->declarations().size(); ++i) {
            if (i) _out->writeString(", ");
            grp->declarations()[i]->visit(this);
        }
    }